

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool __thiscall xla::GraphCycles::IsReachableNonConst(GraphCycles *this,int32_t x,int32_t y)

{
  int upper_bound;
  Rep *r;
  pointer pNVar1;
  bool bVar2;
  
  bVar2 = true;
  if (x != y) {
    r = this->rep_;
    pNVar1 = (r->nodes_).
             super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    upper_bound = pNVar1[y].rank;
    if (pNVar1[x].rank < upper_bound) {
      bVar2 = ForwardDFS(r,x,upper_bound);
      bVar2 = !bVar2;
      ClearVisitedBits(r,&r->deltaf_);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool GraphCycles::IsReachableNonConst(int32_t x, int32_t y) {
  if (x == y) return true;
  Rep* r = rep_;
  Node* nx = &r->nodes_[x];
  Node* ny = &r->nodes_[y];

  if (nx->rank >= ny->rank) {
    // x cannot reach y since it is after it in the topological ordering
    return false;
  }

  // See if x can reach y using a DFS search that is limited to y's rank
  bool reachable = !ForwardDFS(r, x, ny->rank);

  // Clear any visited markers left by ForwardDFS.
  ClearVisitedBits(r, r->deltaf_);
  return reachable;
}